

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rbuSaveState(sqlite3rbu *p,int eStage)

{
  sqlite3 *db;
  char *zSql;
  rbu_file *local_60;
  int local_54;
  int rc;
  rbu_file *pFd;
  sqlite3_stmt *pInsert;
  sqlite3rbu *psStack_38;
  int eStage_local;
  sqlite3rbu *p_local;
  
  if ((p->rc == 0) || (p->rc == 0x65)) {
    pFd = (rbu_file *)0x0;
    if (p->zTarget == (char *)0x0) {
      local_60 = p->pRbuFd;
    }
    else {
      local_60 = p->pTargetFd;
    }
    db = p->dbRbu;
    pInsert._4_4_ = eStage;
    psStack_38 = p;
    zSql = sqlite3_mprintf("INSERT OR REPLACE INTO %s.rbu_state(k, v) VALUES (%d, %d), (%d, %Q), (%d, %Q), (%d, %d), (%d, %d), (%d, %lld), (%d, %lld), (%d, %lld), (%d, %lld), (%d, %Q)  "
                           ,p->zStateDb,1,(ulong)(uint)eStage,2,(p->objiter).zTbl,3,
                           (p->objiter).zIdx,4,p->nStep,5,p->nProgress,6,p->iWalCksum,7,
                           (ulong)local_60->iCookie,8,p->iOalSz,9,p->nPhaseOneStep,10,
                           (p->objiter).zDataTbl);
    local_54 = prepareFreeAndCollectError(db,(sqlite3_stmt **)&pFd,&p->zErrmsg,zSql);
    if (local_54 == 0) {
      sqlite3_step((sqlite3_stmt *)pFd);
      local_54 = sqlite3_finalize((sqlite3_stmt *)pFd);
    }
    if (local_54 != 0) {
      psStack_38->rc = local_54;
    }
  }
  return;
}

Assistant:

static void rbuSaveState(sqlite3rbu *p, int eStage){
  if( p->rc==SQLITE_OK || p->rc==SQLITE_DONE ){
    sqlite3_stmt *pInsert = 0;
    rbu_file *pFd = (rbuIsVacuum(p) ? p->pRbuFd : p->pTargetFd);
    int rc;

    assert( p->zErrmsg==0 );
    rc = prepareFreeAndCollectError(p->dbRbu, &pInsert, &p->zErrmsg, 
        sqlite3_mprintf(
          "INSERT OR REPLACE INTO %s.rbu_state(k, v) VALUES "
          "(%d, %d), "
          "(%d, %Q), "
          "(%d, %Q), "
          "(%d, %d), "
          "(%d, %d), "
          "(%d, %lld), "
          "(%d, %lld), "
          "(%d, %lld), "
          "(%d, %lld), "
          "(%d, %Q)  ",
          p->zStateDb,
          RBU_STATE_STAGE, eStage,
          RBU_STATE_TBL, p->objiter.zTbl, 
          RBU_STATE_IDX, p->objiter.zIdx, 
          RBU_STATE_ROW, p->nStep, 
          RBU_STATE_PROGRESS, p->nProgress,
          RBU_STATE_CKPT, p->iWalCksum,
          RBU_STATE_COOKIE, (i64)pFd->iCookie,
          RBU_STATE_OALSZ, p->iOalSz,
          RBU_STATE_PHASEONESTEP, p->nPhaseOneStep,
          RBU_STATE_DATATBL, p->objiter.zDataTbl
      )
    );
    assert( pInsert==0 || rc==SQLITE_OK );

    if( rc==SQLITE_OK ){
      sqlite3_step(pInsert);
      rc = sqlite3_finalize(pInsert);
    }
    if( rc!=SQLITE_OK ) p->rc = rc;
  }
}